

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_add_callback_data(archive *_a,void *client_data,uint iindex)

{
  undefined4 *puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  char *fmt;
  long lVar5;
  ulong uVar6;
  
  iVar2 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_callback_data");
  if (iVar2 != -0x1e) {
    uVar3 = (uint)_a[1].error_string.buffer_length;
    if (uVar3 < iindex) {
      fmt = "Invalid index specified.";
      iVar2 = 0x16;
    }
    else {
      pvVar4 = *(void **)&_a[1].current_codepage;
      uVar3 = uVar3 + 1;
      *(uint *)&_a[1].error_string.buffer_length = uVar3;
      pvVar4 = realloc(pvVar4,(ulong)uVar3 * 0x18);
      if (pvVar4 != (void *)0x0) {
        *(void **)&_a[1].current_codepage = pvVar4;
        iVar2 = (int)_a[1].error_string.buffer_length;
        uVar3 = iVar2 - 1;
        if (iindex < uVar3) {
          uVar6 = (ulong)uVar3;
          lVar5 = (long)pvVar4 + 0x10;
          do {
            *(undefined8 *)(lVar5 + uVar6 * 0x18) =
                 *(undefined8 *)(lVar5 + (ulong)(iVar2 - 2) * 0x18);
            puVar1 = (undefined4 *)(lVar5 + -0x10 + uVar6 * 0x18);
            *puVar1 = 0xffffffff;
            puVar1[1] = 0xffffffff;
            puVar1[2] = 0xffffffff;
            puVar1[3] = 0xffffffff;
            lVar5 = lVar5 + -0x18;
            uVar3 = uVar3 - 1;
          } while (iindex < uVar3);
        }
        *(void **)((long)pvVar4 + (ulong)iindex * 0x18 + 0x10) = client_data;
        puVar1 = (undefined4 *)((long)pvVar4 + (ulong)iindex * 0x18);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        return 0;
      }
      fmt = "No memory.";
      iVar2 = 0xc;
    }
    archive_set_error(_a,iVar2,fmt);
  }
  return -0x1e;
}

Assistant:

int
archive_read_add_callback_data(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	void *p;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_add_callback_data");
	if (iindex > a->client.nodes) {
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	p = realloc(a->client.dataset, sizeof(*a->client.dataset)
		* (++(a->client.nodes)));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset = (struct archive_read_data_node *)p;
	for (i = a->client.nodes - 1; i > iindex && i > 0; i--) {
		a->client.dataset[i].data = a->client.dataset[i-1].data;
		a->client.dataset[i].begin_position = -1;
		a->client.dataset[i].total_size = -1;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}